

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O1

bool __thiscall Finder::check(Finder *this)

{
  element_type *peVar1;
  unsigned_long i;
  bool bVar2;
  long lVar3;
  QPDFTokenizer tokenizer;
  Token t;
  QPDFTokenizer aQStack_108 [8];
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  long *local_c8;
  long local_b8 [2];
  long *local_a8;
  long local_98 [2];
  Token local_88 [8];
  long *local_80;
  long local_70 [2];
  long *local_60;
  long local_50 [2];
  long *local_40;
  long local_30 [2];
  
  QPDFTokenizer::QPDFTokenizer(aQStack_108);
  local_100 = (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8 = (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
    }
  }
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"finder","");
  QPDFTokenizer::readToken(local_88,aQStack_108,&local_100,&local_f0,1,0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  lVar3 = (**(code **)(*(long *)(this->is).
                                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x20))();
  QPDFTokenizer::Token::Token((Token *)&local_f0,tt_word,(string *)&this->str);
  bVar2 = QPDFTokenizer::Token::operator==(local_88,(Token *)&local_f0);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  peVar1 = (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  i = (this->str)._M_string_length;
  if ((long)i < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
  }
  (**(code **)(*(long *)peVar1 + 0x28))(peVar1,lVar3 - i,0);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  QPDFTokenizer::~QPDFTokenizer(aQStack_108);
  return bVar2;
}

Assistant:

bool
Finder::check()
{
    QPDFTokenizer tokenizer;
    QPDFTokenizer::Token t = tokenizer.readToken(is, "finder", true);
    qpdf_offset_t offset = this->is->tell();
    bool result = (t == QPDFTokenizer::Token(QPDFTokenizer::tt_word, str));
    this->is->seek(offset - QIntC::to_offset(this->str.length()), SEEK_SET);
    return result;
}